

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall google::protobuf::FieldOptions::SharedCtor(FieldOptions *this)

{
  this->_cached_size_ = 0;
  this->_has_bits_[0] = 0;
  this->ctype_ = 0;
  *(undefined4 *)((long)&this->ctype_ + 3) = 0;
  this->experimental_map_key_ = (string *)internal::kEmptyString_abi_cxx11_;
  this->weak_ = false;
  return;
}

Assistant:

void FieldOptions::SharedCtor() {
  _cached_size_ = 0;
  ctype_ = 0;
  packed_ = false;
  lazy_ = false;
  deprecated_ = false;
  experimental_map_key_ = const_cast< ::std::string*>(&::google::protobuf::internal::kEmptyString);
  weak_ = false;
  ::memset(_has_bits_, 0, sizeof(_has_bits_));
}